

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalize_fake_var_array.hpp
# Opt level: O3

void __thiscall
front::optimization::scalize_fake_var_array::ScalizeFakeVarArray::optimize_bmir
          (ScalizeFakeVarArray *this,MirPackage *package,BmirVariableTable *bmirVariableTable,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
          *funcInsts,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          *messages)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  string local_50;
  
  p_Var1 = (funcInsts->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(funcInsts->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,*(long *)(p_Var1 + 1),
                 (long)&(p_Var1[1]._M_parent)->_M_color + *(long *)(p_Var1 + 1));
      optimize_functiom(this,&local_50,package,bmirVariableTable,
                        (vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                         *)(p_Var1 + 2));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return;
}

Assistant:

virtual void optimize_bmir(
      mir::inst::MirPackage& package,
      bmir_variable_table::BmirVariableTable& bmirVariableTable,
      std::map<std::string, std::vector<irGenerator::Instruction>>& funcInsts,
      std::map<std::string, std::any>& messages) {
    for (auto& func : funcInsts) {
      optimize_functiom(func.first, package, bmirVariableTable, func.second);
    }
  }